

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O0

bool __thiscall cmFindCommon::ComputeIfDebugModeWanted(cmFindCommon *this)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  cmake *this_01;
  bool local_4e;
  allocator<char> local_39;
  string local_38;
  cmFindCommon *local_18;
  cmFindCommon *this_local;
  
  local_18 = this;
  bVar3 = cmMakefile::GetDebugFindPkgMode(this->Makefile);
  bVar2 = false;
  bVar1 = false;
  local_4e = true;
  if (!bVar3) {
    this_00 = this->Makefile;
    std::allocator<char>::allocator();
    bVar2 = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"CMAKE_FIND_DEBUG_MODE",&local_39);
    bVar1 = true;
    bVar3 = cmMakefile::IsOn(this_00,&local_38);
    local_4e = true;
    if (!bVar3) {
      this_01 = cmMakefile::GetCMakeInstance(this->Makefile);
      local_4e = cmake::GetDebugFindOutput(this_01);
    }
  }
  this_local._7_1_ = local_4e;
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_38);
  }
  if (bVar2) {
    std::allocator<char>::~allocator(&local_39);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFindCommon::ComputeIfDebugModeWanted()
{
  return this->Makefile->GetDebugFindPkgMode() ||
    this->Makefile->IsOn("CMAKE_FIND_DEBUG_MODE") ||
    this->Makefile->GetCMakeInstance()->GetDebugFindOutput();
}